

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

bool __thiscall idx2::mallocator::Alloc(mallocator *this,buffer *Buf,i64 Bytes)

{
  byte *pbVar1;
  undefined1 local_38 [8];
  printer Pr;
  i64 Bytes_local;
  buffer *Buf_local;
  mallocator *this_local;
  
  Pr.File = (FILE *)Bytes;
  pbVar1 = (byte *)malloc(Bytes);
  Buf->Data = pbVar1;
  if (Buf->Data == (byte *)0x0) {
    fprintf(_stderr,"Condition \"%s\" failed, ","!(!(Buf->Data)) && \"Fatal error!\"");
    fprintf(_stderr,"in file %s, line %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Memory.cpp"
            ,0x6c);
    fprintf(_stderr,"Out of memory: cannot allocate %lx bytes\n",Pr.File);
    fprintf(_stderr,"\n");
    printer::printer((printer *)local_38,(FILE *)_stderr);
    PrintStacktrace((printer *)local_38);
    exit(1);
  }
  Buf->Bytes = (i64)Pr.File;
  Buf->Alloc = &this->super_allocator;
  return true;
}

Assistant:

bool
mallocator::Alloc(buffer* Buf, i64 Bytes)
{
  idx2_Assert(!Buf->Data || Buf->Bytes == 0, "Buffer not freed before allocating new memory");
  Buf->Data = (byte*)malloc(size_t(Bytes));
  idx2_AbortIf(!(Buf->Data), "Out of memory: cannot allocate %" PRIx64 " bytes\n", Bytes);
  Buf->Bytes = Bytes;
  Buf->Alloc = this;
  return true;
}